

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  undefined4 in_register_00000034;
  TimeValue TVar1;
  
  std::istream::seekg(&this->stream_,
                      CONCAT44(in_register_00000034,__fd) * 0x10 + (this->data_begin_)._M_off,
                      (this->data_begin_)._M_state);
  check_stream(this,"seekg for read");
  TVar1 = read<hta::TimeValue>(this);
  return (ssize_t)TVar1.time.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ;
}

Assistant:

value_type read(pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for read");
        return read<value_type>();
    }